

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

size_t __thiscall anon_unknown.dwarf_d70d23::str_hash::operator()(str_hash *this,char *str)

{
  size_t sStack_20;
  int c;
  unsigned_long hash;
  char *str_local;
  str_hash *this_local;
  
  sStack_20 = 0x1505;
  hash = (unsigned_long)str;
  while( true ) {
    if (*(char *)hash == 0) break;
    sStack_20 = sStack_20 * 0x21 + (long)(int)*(char *)hash;
    hash = hash + 1;
  }
  return sStack_20;
}

Assistant:

size_t operator()(const char* str) const
    {
        // djb2
        unsigned long hash = 5381;
        int c;

        while ((c = *str++) != 0)
            hash = ((hash << 5) + hash) + c;

        return hash;
    }